

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O3

long test_drain_data_cb(cubeb_stream *param_1,void *user_ptr,void *input_buffer,void *output_buffer,
                       long frame_count)

{
  bool bVar1;
  stringstream *psVar2;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  int *local_60;
  AssertHelper local_58;
  AssertionResult local_50;
  char *local_40 [2];
  
  local_50.success_ = output_buffer != (void *)0x0;
  local_50.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!local_50.success_) {
    local_60 = (int *)user_ptr;
    psVar2 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar2);
    *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
    local_68.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2;
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)local_40,&local_50,"output_buffer","false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,0x1fa,local_40[0]);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_40[0] != (char *)0x0) {
      operator_delete__(local_40[0]);
    }
    user_ptr = local_60;
    if (((local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), user_ptr = local_60, bVar1)) &&
       (local_68.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_68.ptr_ + 8))();
      user_ptr = local_60;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_50.success_ = input_buffer == (void *)0x0;
  local_50.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!local_50.success_) {
    psVar2 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar2);
    *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
    local_68.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2;
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)local_40,&local_50,"!input_buffer","false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,0x1fb,local_40[0]);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_40[0] != (char *)0x0) {
      operator_delete__(local_40[0]);
    }
    if (((local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_68.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_68.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  *(int *)user_ptr = *user_ptr + 1;
  return frame_count + -1;
}

Assistant:

long test_drain_data_cb(cubeb_stream * /*stm*/, void * user_ptr,
                        const void * input_buffer,
                        void * output_buffer, long frame_count)
{
  EXPECT_TRUE(output_buffer);
  EXPECT_TRUE(!input_buffer);
  auto cb_count = static_cast<int *>(user_ptr);
  (*cb_count)++;
  return frame_count - 1;
}